

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v7::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t count;
  uint *__first;
  uint *puVar1;
  uint *data;
  size_t size;
  bigint *other_local;
  bigint *this_local;
  
  count = buffer<unsigned_int>::size((buffer<unsigned_int> *)other);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,count);
  __first = buffer<unsigned_int>::data((buffer<unsigned_int> *)other);
  puVar1 = buffer<unsigned_int>::data((buffer<unsigned_int> *)this);
  puVar1 = make_checked<unsigned_int>(puVar1,count);
  std::copy<unsigned_int_const*,unsigned_int*>(__first,__first + count,puVar1);
  this->exp_ = other->exp_;
  return;
}

Assistant:

void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    std::copy(data, data + size, make_checked(bigits_.data(), size));
    exp_ = other.exp_;
  }